

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::
~Persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
           *this)

{
  list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *this_00;
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
  *transverse_ref;
  iterator __end0;
  iterator __begin0;
  map<unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  *__range3;
  Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  __end0 = std::
           map<unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
           ::begin(&this->transverse_idx_);
  transverse_ref =
       (pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
        *)std::
          map<unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
          ::end(&this->transverse_idx_);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&transverse_ref);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
             ::operator*(&__end0);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)2,Gudhi::persistent_cohomology::cam_h_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,Gudhi::persistent_cohomology::Field_Zp>::~Persistent_cohomology()::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>*)_1_>
              (*(list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)2,Gudhi::persistent_cohomology::cam_h_tag,1u>,unsigned_long,false,void>
                 **)&ppVar2->second);
    this_00 = *(list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
                **)&ppVar2->second;
    if (this_00 !=
        (list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
         *)0x0) {
      boost::intrusive::
      list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
      ::~list(this_00);
      operator_delete(this_00,0x10);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
    ::operator++(&__end0);
  }
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>_>
  ::~Simple_object_pool(&this->cell_pool_);
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_>
  ::~Simple_object_pool(&this->column_pool_);
  std::
  vector<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>_>_>
  ::~vector(&this->persistent_pairs_);
  std::
  map<unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  ::~map(&this->transverse_idx_);
  std::
  unordered_map<unsigned_char,_unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  ::~unordered_map(&this->zero_cocycles_);
  boost::intrusive::
  set<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>,_boost::intrusive::constant_time_size<false>_>
  ::~set(&this->cam_);
  std::
  vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*>_>
  ::~vector(&this->ds_repr_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->ds_parent_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->ds_rank_);
  Field_Zp::~Field_Zp(&this->coeff_field_);
  return;
}

Assistant:

~Persistent_cohomology() {
    // Clean the transversal lists
    for (auto & transverse_ref : transverse_idx_) {
      // Destruct all the cells
      transverse_ref.second.row_->clear_and_dispose([&](Cell*p){p->~Cell();});
      delete transverse_ref.second.row_;
    }
  }